

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_array.h
# Opt level: O0

void __thiscall
absl::FixedArray<S2XYZFaceSiTi,_18446744073709551615UL,_std::allocator<S2XYZFaceSiTi>_>::
NonEmptyInlinedStorage::AnnotateConstruct(NonEmptyInlinedStorage *this,size_type n)

{
  size_type n_local;
  NonEmptyInlinedStorage *this_local;
  
  return;
}

Assistant:

void FixedArray<T, N, A>::NonEmptyInlinedStorage::AnnotateConstruct(
    typename FixedArray<T, N, A>::size_type n) {
#ifdef ADDRESS_SANITIZER
  if (!n) return;
  ANNOTATE_CONTIGUOUS_CONTAINER(data(), RedzoneEnd(), RedzoneEnd(), data() + n);
  ANNOTATE_CONTIGUOUS_CONTAINER(RedzoneBegin(), data(), data(), RedzoneBegin());
#endif                   // ADDRESS_SANITIZER
  static_cast<void>(n);  // Mark used when not in asan mode
}